

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O2

double Tunings::locale_atof(char *s)

{
  allocator local_1c1;
  double result;
  double local_1b8;
  locale local_1b0 [8];
  string local_1a8 [32];
  istringstream istr;
  
  result = 0.0;
  std::__cxx11::string::string(local_1a8,s,&local_1c1);
  std::__cxx11::istringstream::istringstream((istringstream *)&istr,local_1a8,_S_in);
  std::__cxx11::string::~string(local_1a8);
  std::locale::locale((locale *)local_1a8,"C");
  std::ios::imbue(local_1b0);
  std::locale::~locale(local_1b0);
  std::locale::~locale((locale *)local_1a8);
  std::istream::_M_extract<double>((double *)&istr);
  local_1b8 = result;
  std::__cxx11::istringstream::~istringstream((istringstream *)&istr);
  return local_1b8;
}

Assistant:

inline double locale_atof(const char *s)
{
    double result = 0;
    std::istringstream istr(s);
    istr.imbue(std::locale("C"));
    istr >> result;
    return result;
}